

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O1

USet * uset_open_63(UChar32 start,UChar32 end)

{
  UnicodeSet *this;
  undefined4 in_register_00000034;
  
  this = (UnicodeSet *)
         icu_63::UMemory::operator_new((UMemory *)0x58,CONCAT44(in_register_00000034,end));
  if (this == (UnicodeSet *)0x0) {
    this = (UnicodeSet *)0x0;
  }
  else {
    icu_63::UnicodeSet::UnicodeSet(this,start,end);
  }
  return (USet *)this;
}

Assistant:

U_CAPI USet* U_EXPORT2
uset_open(UChar32 start, UChar32 end) {
    return (USet*) new UnicodeSet(start, end);
}